

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O3

void __thiscall Automaton::buildIncludesDigraph(Automaton *this)

{
  Name *this_00;
  _Base_ptr *__k;
  Grammar *pGVar1;
  QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
  *pQVar2;
  _List_node_base *p_Var3;
  const_iterator cVar4;
  const_iterator cVar5;
  iterator iVar6;
  _Base_ptr p_Var7;
  iterator other;
  iterator iVar8;
  _Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>
  _Var9;
  _Rb_tree_node_base *p_Var10;
  _List_node_base *extraout_RDX;
  _Base_ptr *pp_Var11;
  _List_node_base *extraout_RDX_00;
  _List_node_base *extraout_RDX_01;
  Name NVar12;
  Name extraout_RDX_02;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  Node<Include> *this_01;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
  pVar16;
  Include data;
  Include data_00;
  Node<Include> *local_80;
  _Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>
  local_58;
  key_type local_48;
  key_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (Node<Include> *)
            (this->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (this_01 != (Node<Include> *)&this->states) {
    do {
      this_00 = &this_01[1].data.nt;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
      p_Var10 = (_Rb_tree_node_base *)this_01[1].data.nt._M_node[2]._M_next;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
      if (p_Var10 != (_Rb_tree_node_base *)(this_01[1].data.nt._M_node + 1)) {
        do {
          local_48._M_node = *(_List_node_base **)(p_Var10 + 1);
          pGVar1 = this->_M_grammar;
          local_40._M_node = local_48._M_node;
          cVar4 = std::
                  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                  ::find(&(pGVar1->non_terminals)._M_t,&local_40);
          if ((((_Rb_tree_header *)cVar4._M_node !=
                &(pGVar1->non_terminals)._M_t._M_impl.super__Rb_tree_header) &&
              (pQVar2 = (this->_M_grammar->rule_map).d.d.ptr,
              pQVar2 != (QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
                         *)0x0)) &&
             (pVar16 = std::
                       _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
                       ::equal_range(&(pQVar2->m)._M_t,&local_48),
             pVar16.first._M_node._M_node != pVar16.second._M_node._M_node)) {
            do {
              local_58 = pVar16.second._M_node;
              _Var9 = pVar16.first._M_node;
              p_Var14 = _Var9._M_node[1]._M_parent;
              local_80 = this_01;
              for (p_Var15 = p_Var14->_M_right; p_Var15 != (_Base_ptr)&p_Var14->_M_right;
                  p_Var15 = *(_Base_ptr *)p_Var15) {
                p_Var14 = *(_Base_ptr *)p_Var15;
                local_40._M_node = (_List_node_base *)p_Var15->_M_left;
                pGVar1 = this->_M_grammar;
                __k = &p_Var15->_M_left;
                cVar4 = std::
                        _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                        ::find(&(pGVar1->non_terminals)._M_t,&local_40);
                if (((_Rb_tree_header *)cVar4._M_node ==
                     &(pGVar1->non_terminals)._M_t._M_impl.super__Rb_tree_header) ||
                   (NVar12._M_node = extraout_RDX,
                   p_Var14 != (_Base_ptr)&(_Var9._M_node[1]._M_parent)->_M_right)) {
                  local_40._M_node = (_List_node_base *)0x0;
                  p_Var3 = local_80[1].data.nt._M_node;
                  if (p_Var3 == (_List_node_base *)0x0) {
                    local_80 = (Node<Include> *)0x0;
                  }
                  else {
                    cVar5 = std::
                            _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>
                            ::find((_Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>
                                    *)&p_Var3->_M_prev,(key_type *)__k);
                    pp_Var11 = &cVar5._M_node[1]._M_parent;
                    if (cVar5._M_node == (_Base_ptr)(local_80[1].data.nt._M_node + 1)) {
                      pp_Var11 = (_Base_ptr *)&local_40;
                    }
                    local_80 = (Node<Include> *)*pp_Var11;
                  }
                  pGVar1 = this->_M_grammar;
                  local_40._M_node = (_List_node_base *)*__k;
                  cVar4 = std::
                          _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                          ::find(&(pGVar1->non_terminals)._M_t,&local_40);
                  if ((_Rb_tree_header *)cVar4._M_node !=
                      &(pGVar1->non_terminals)._M_t._M_impl.super__Rb_tree_header) {
                    p_Var7 = _Var9._M_node[1]._M_parent;
                    pp_Var11 = &p_Var7->_M_right;
                    NVar12._M_node = extraout_RDX_00;
                    p_Var13 = p_Var14;
                    if (p_Var14 != (_Base_ptr)pp_Var11) {
                      do {
                        local_40._M_node = (_List_node_base *)p_Var13->_M_left;
                        iVar6 = std::
                                _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                                ::find(&(this->nullables)._M_t,&local_40);
                        p_Var14 = p_Var13;
                        if ((_Rb_tree_header *)iVar6._M_node ==
                            &(this->nullables)._M_t._M_impl.super__Rb_tree_header) break;
                        p_Var13 = *(_Base_ptr *)p_Var13;
                        p_Var14 = (_Base_ptr)pp_Var11;
                      } while (p_Var13 != (_Base_ptr)pp_Var11);
                      p_Var7 = _Var9._M_node[1]._M_parent;
                      NVar12._M_node = extraout_RDX_01;
                    }
                    if (p_Var14 == (_Base_ptr)&p_Var7->_M_right) goto LAB_0010c7cb;
                  }
                }
                else {
LAB_0010c7cb:
                  data.nt._M_node = NVar12._M_node;
                  data.state._M_node = local_48._M_node;
                  other = Node<Include>::get(this_01,data);
                  data_00.nt._M_node = extraout_RDX_02._M_node;
                  data_00.state._M_node = (_List_node_base *)*__k;
                  iVar8 = Node<Include>::get(local_80,data_00);
                  Node<Include>::insertEdge((Node<Include> *)(iVar8._M_node + 1),other);
                }
                p_Var14 = _Var9._M_node[1]._M_parent;
              }
              _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node);
              pVar16.second._M_node = local_58._M_node;
              pVar16.first._M_node = _Var9._M_node;
            } while (_Var9._M_node != local_58._M_node);
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                    ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_00);
        } while (p_Var10 != (_Rb_tree_node_base *)(this_00->_M_node + 1));
      }
      this_01 = *(Node<Include> **)this_01;
    } while (this_01 != (Node<Include> *)&this->states);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::buildIncludesDigraph ()
{
  for (StatePointer pp = states.begin (); pp != states.end (); ++pp)
    {
      for (Bundle::iterator a = pp->bundle.begin (); a != pp->bundle.end (); ++a)
        {
          Name name = a.key ();

          if (! _M_grammar->isNonTerminal (name))
            continue;

          const auto range = std::as_const(_M_grammar->rule_map).equal_range(name);
          for (auto it = range.first; it != range.second; ++it)
            {
              const RulePointer &rule = *it;
              StatePointer p = pp;

              for (NameList::iterator A = rule->rhs.begin (); A != rule->rhs.end (); ++A)
                {
                  NameList::iterator dot = A;
                  ++dot;

                  if (_M_grammar->isNonTerminal (*A) && dot == rule->rhs.end ())
                    {
                      // found an include edge.
                      IncludesGraph::iterator target = IncludesGraph::get (Include (pp, name));
                      IncludesGraph::iterator source = IncludesGraph::get (Include (p, *A));

                      source->insertEdge (target);

#ifndef QLALR_NO_DEBUG_INCLUDES
                      qerr() << "*** (" << id (p) << ", " << *A << ") includes (" << id (pp) << ", " << *name << ")" << Qt::endl;
#endif // QLALR_NO_DEBUG_INCLUDES

                      continue;
                    }

                  p = p->bundle.value (*A);

                  if (! _M_grammar->isNonTerminal (*A))
                    continue;

                  NameList::iterator first_not_nullable = std::find_if(dot, rule->rhs.end(), NotNullable(this));
                  if (first_not_nullable != rule->rhs.end ())
                    continue;

                  // found an include edge.
                  IncludesGraph::iterator target = IncludesGraph::get (Include (pp, name));
                  IncludesGraph::iterator source = IncludesGraph::get (Include (p, *A));

                  source->insertEdge (target);

#ifndef QLALR_NO_DEBUG_INCLUDES
                  qerr() << "*** (" << id (p) << ", " << *A << ") includes (" << id (pp) << ", " << *name << ")" << Qt::endl;
#endif // QLALR_NO_DEBUG_INCLUDES
                }
            }
        }
    }
}